

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O2

string * __thiscall
anurbs::Entry<anurbs::BrepTrim>::type_name_abi_cxx11_
          (string *__return_storage_ptr__,Entry<anurbs::BrepTrim> *this)

{
  BrepTrim::type_name_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const override
    {
        return TData::type_name();
    }